

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

xmlNodePtr xmlNewTextChild(xmlNodePtr parent,xmlNsPtr ns,xmlChar *name,xmlChar *content)

{
  _xmlNode *p_Var1;
  xmlNodePtr prev;
  xmlNodePtr cur;
  xmlChar *content_local;
  xmlChar *name_local;
  xmlNsPtr ns_local;
  xmlNodePtr parent_local;
  
  if (parent == (xmlNodePtr)0x0) {
    parent_local = (xmlNodePtr)0x0;
  }
  else if (name == (xmlChar *)0x0) {
    parent_local = (xmlNodePtr)0x0;
  }
  else {
    if (parent->type == XML_ELEMENT_NODE) {
      if (ns == (xmlNsPtr)0x0) {
        prev = xmlNewDocRawNode(parent->doc,parent->ns,name,content);
      }
      else {
        prev = xmlNewDocRawNode(parent->doc,ns,name,content);
      }
    }
    else if ((parent->type == XML_DOCUMENT_NODE) || (parent->type == XML_HTML_DOCUMENT_NODE)) {
      if (ns == (xmlNsPtr)0x0) {
        prev = xmlNewDocRawNode((xmlDocPtr)parent,(xmlNsPtr)0x0,name,content);
      }
      else {
        prev = xmlNewDocRawNode((xmlDocPtr)parent,ns,name,content);
      }
    }
    else {
      if (parent->type != XML_DOCUMENT_FRAG_NODE) {
        return (xmlNodePtr)0x0;
      }
      prev = xmlNewDocRawNode(parent->doc,ns,name,content);
    }
    if (prev == (xmlNodePtr)0x0) {
      parent_local = (xmlNodePtr)0x0;
    }
    else {
      prev->type = XML_ELEMENT_NODE;
      prev->parent = parent;
      prev->doc = parent->doc;
      if (parent->children == (_xmlNode *)0x0) {
        parent->children = prev;
        parent->last = prev;
      }
      else {
        p_Var1 = parent->last;
        p_Var1->next = prev;
        prev->prev = p_Var1;
        parent->last = prev;
      }
      parent_local = prev;
    }
  }
  return parent_local;
}

Assistant:

xmlNodePtr
xmlNewTextChild(xmlNodePtr parent, xmlNsPtr ns,
            const xmlChar *name, const xmlChar *content) {
    xmlNodePtr cur, prev;

    if (parent == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNewTextChild : parent == NULL\n");
#endif
	return(NULL);
    }

    if (name == NULL) {
#ifdef DEBUG_TREE
        xmlGenericError(xmlGenericErrorContext,
		"xmlNewTextChild : name == NULL\n");
#endif
	return(NULL);
    }

    /*
     * Allocate a new node
     */
    if (parent->type == XML_ELEMENT_NODE) {
	if (ns == NULL)
	    cur = xmlNewDocRawNode(parent->doc, parent->ns, name, content);
	else
	    cur = xmlNewDocRawNode(parent->doc, ns, name, content);
    } else if ((parent->type == XML_DOCUMENT_NODE) ||
	       (parent->type == XML_HTML_DOCUMENT_NODE)) {
	if (ns == NULL)
	    cur = xmlNewDocRawNode((xmlDocPtr) parent, NULL, name, content);
	else
	    cur = xmlNewDocRawNode((xmlDocPtr) parent, ns, name, content);
    } else if (parent->type == XML_DOCUMENT_FRAG_NODE) {
	    cur = xmlNewDocRawNode( parent->doc, ns, name, content);
    } else {
	return(NULL);
    }
    if (cur == NULL) return(NULL);

    /*
     * add the new element at the end of the children list.
     */
    cur->type = XML_ELEMENT_NODE;
    cur->parent = parent;
    cur->doc = parent->doc;
    if (parent->children == NULL) {
        parent->children = cur;
	parent->last = cur;
    } else {
        prev = parent->last;
	prev->next = cur;
	cur->prev = prev;
	parent->last = cur;
    }

    return(cur);
}